

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

iterator __thiscall
cmLinkedTree<cmState::SnapshotDataType>::Push
          (cmLinkedTree<cmState::SnapshotDataType> *this,iterator it,SnapshotDataType *t)

{
  iterator iVar1;
  undefined1 auStack_108 [232];
  
  cmState::SnapshotDataType::SnapshotDataType((SnapshotDataType *)auStack_108,t);
  iVar1 = Push_impl(this,it,(SnapshotDataType *)auStack_108);
  std::__cxx11::string::~string((string *)(auStack_108 + 0xa8));
  return iVar1;
}

Assistant:

iterator Push(iterator it, T t)
  {
    return Push_impl(it, t);
  }